

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>
               (undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  reference out;
  tuple<char,_int> *elem;
  iterator __end0;
  iterator __begin0;
  list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *__range3;
  list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                 (in_stack_ffffffffffffffb8);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::end
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    out = std::_List_iterator<std::tuple<char,_int>_>::operator*
                    ((_List_iterator<std::tuple<char,_int>_> *)0x199339);
    deserialize<std::tuple<char,int>,InputStream>(out,(InputStream *)in_stack_ffffffffffffffb8);
    std::_List_iterator<std::tuple<char,_int>_>::operator++(&local_30);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }